

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::ParseURLProtocol(string *URL,string *protocol,string *dataglom)

{
  bool bVar1;
  string sStack_118;
  RegularExpression urlRe;
  
  RegularExpression::RegularExpression(&urlRe,"([a-zA-Z0-9]*)://(.*)");
  bVar1 = RegularExpression::find(&urlRe,URL);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_(&sStack_118,&urlRe,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&sStack_118);
    std::__cxx11::string::~string((string *)&sStack_118);
    RegularExpression::match_abi_cxx11_(&sStack_118,&urlRe,2);
    std::__cxx11::string::operator=((string *)dataglom,(string *)&sStack_118);
    std::__cxx11::string::~string((string *)&sStack_118);
  }
  RegularExpression::~RegularExpression(&urlRe);
  return bVar1;
}

Assistant:

bool SystemTools::ParseURLProtocol( const std::string& URL,
                                    std::string& protocol,
                                    std::string& dataglom )
{
  // match 0 entire url
  // match 1 protocol
  // match 2 dataglom following protocol://
  kwsys::RegularExpression urlRe( VTK_URL_PROTOCOL_REGEX );

  if ( ! urlRe.find( URL ) ) return false;

  protocol = urlRe.match( 1 );
  dataglom = urlRe.match( 2 );

  return true;
}